

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

VariableDimensionSyntax * __thiscall slang::parsing::Parser::parseDimension(Parser *this)

{
  Token star;
  Token colon_00;
  Token dollar_00;
  Token closeBracket_00;
  bool bVar1;
  ParserBase *in_RDI;
  Token TVar2;
  Token closeBracket;
  SelectorSyntax *selector;
  Token colon;
  ColonExpressionClauseSyntax *colonExpressionClause;
  Token dollar;
  DimensionSpecifierSyntax *specifier;
  Token openBracket;
  ParserBase *in_stack_ffffffffffffff18;
  Parser *in_stack_ffffffffffffff20;
  undefined6 in_stack_ffffffffffffff28;
  TokenKind in_stack_ffffffffffffff2e;
  ParserBase *in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffffa8 [16];
  unkbyte10 Var3;
  TokenKind local_38;
  Parser *this_00;
  VariableDimensionSyntax *local_8;
  
  Var3 = in_stack_ffffffffffffffa8._6_10_;
  bVar1 = ParserBase::peek(in_RDI,in_stack_ffffffffffffff2e);
  if (bVar1) {
    ParserBase::consume(in_stack_ffffffffffffff40);
    this_00 = (Parser *)0x0;
    TVar2 = ParserBase::peek(in_stack_ffffffffffffff18);
    local_38 = TVar2.kind;
    if (local_38 != CloseBracket) {
      if (local_38 == Star) {
        in_stack_ffffffffffffff20 = (Parser *)(in_RDI + 1);
        ParserBase::consume(in_stack_ffffffffffffff40);
        star.info = (Info *)in_stack_ffffffffffffff20;
        star._0_8_ = in_stack_ffffffffffffff18;
        slang::syntax::SyntaxFactory::wildcardDimensionSpecifier((SyntaxFactory *)0x87d404,star);
      }
      else if (local_38 == Dollar) {
        TVar2 = ParserBase::consume(in_stack_ffffffffffffff40);
        Var3 = TVar2._6_10_;
        bVar1 = ParserBase::peek(in_RDI,local_38);
        if (bVar1) {
          ParserBase::consume(in_stack_ffffffffffffff40);
          in_stack_ffffffffffffff18 = in_RDI + 1;
          parseExpression(in_stack_ffffffffffffff20);
          colon_00.rawLen._2_2_ = local_38;
          colon_00._0_6_ = in_stack_ffffffffffffff28;
          colon_00.info = (Info *)in_RDI;
          slang::syntax::SyntaxFactory::colonExpressionClause
                    ((SyntaxFactory *)in_stack_ffffffffffffff20,colon_00,
                     (ExpressionSyntax *)in_stack_ffffffffffffff18);
        }
        dollar_00.rawLen._2_2_ = local_38;
        dollar_00._0_6_ = in_stack_ffffffffffffff28;
        dollar_00.info = (Info *)in_RDI;
        slang::syntax::SyntaxFactory::queueDimensionSpecifier
                  ((SyntaxFactory *)in_stack_ffffffffffffff20,dollar_00,
                   (ColonExpressionClauseSyntax *)in_stack_ffffffffffffff18);
      }
      else {
        parseElementSelector(this_00);
        slang::syntax::SyntaxFactory::rangeDimensionSpecifier
                  ((SyntaxFactory *)in_stack_ffffffffffffff20,
                   (SelectorSyntax *)in_stack_ffffffffffffff18);
      }
    }
    TVar2 = ParserBase::expect((ParserBase *)((unkuint10)Var3 >> 0x10),(TokenKind)Var3);
    closeBracket_00.rawLen._2_2_ = local_38;
    closeBracket_00._0_6_ = in_stack_ffffffffffffff28;
    closeBracket_00.info = (Info *)in_RDI;
    local_8 = slang::syntax::SyntaxFactory::variableDimension
                        ((SyntaxFactory *)in_stack_ffffffffffffff20,TVar2,
                         (DimensionSpecifierSyntax *)in_stack_ffffffffffffff18,closeBracket_00);
  }
  else {
    local_8 = (VariableDimensionSyntax *)0x0;
  }
  return local_8;
}

Assistant:

VariableDimensionSyntax* Parser::parseDimension() {
    if (!peek(TokenKind::OpenBracket))
        return nullptr;

    auto openBracket = consume();

    DimensionSpecifierSyntax* specifier = nullptr;
    switch (peek().kind) {
        case TokenKind::CloseBracket:
            // empty specifier
            break;
        case TokenKind::Star:
            specifier = &factory.wildcardDimensionSpecifier(consume());
            break;
        case TokenKind::Dollar: {
            auto dollar = consume();

            ColonExpressionClauseSyntax* colonExpressionClause = nullptr;
            if (peek(TokenKind::Colon)) {
                auto colon = consume();
                colonExpressionClause = &factory.colonExpressionClause(colon, parseExpression());
            }
            specifier = &factory.queueDimensionSpecifier(dollar, colonExpressionClause);
            break;
        }
        default: {
            auto selector = parseElementSelector();
            SLANG_ASSERT(selector);
            specifier = &factory.rangeDimensionSpecifier(*selector);
            break;
        }
    }

    auto closeBracket = expect(TokenKind::CloseBracket);
    return &factory.variableDimension(openBracket, specifier, closeBracket);
}